

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dfile.cc
# Opt level: O0

ParameterInfo * __thiscall
C3DFile::getParamInfo(ParameterInfo *__return_storage_ptr__,C3DFile *this,char *id_str)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  pointer pGVar5;
  char *__s1;
  pointer pPVar6;
  reference info;
  __normal_iterator<ParameterInfo_*,_std::vector<ParameterInfo,_std::allocator<ParameterInfo>_>_>
  local_130;
  ParameterInfo *local_128;
  __normal_iterator<ParameterInfo_*,_std::vector<ParameterInfo,_std::allocator<ParameterInfo>_>_>
  local_120;
  __normal_iterator<ParameterInfo_*,_std::vector<ParameterInfo,_std::allocator<ParameterInfo>_>_>
  local_118;
  __normal_iterator<const_ParameterInfo_*,_std::vector<ParameterInfo,_std::allocator<ParameterInfo>_>_>
  local_110;
  const_iterator param_iter;
  __normal_iterator<GroupInfo_*,_std::vector<GroupInfo,_std::allocator<GroupInfo>_>_> local_f8;
  __normal_iterator<GroupInfo_*,_std::vector<GroupInfo,_std::allocator<GroupInfo>_>_> local_f0;
  __normal_iterator<const_GroupInfo_*,_std::vector<GroupInfo,_std::allocator<GroupInfo>_>_> local_e8
  ;
  const_iterator group_iter;
  string local_d8 [7];
  Sint8 group_id;
  string local_b8 [32];
  string local_98 [8];
  string param;
  string group;
  allocator<char> local_41;
  string local_40 [8];
  string id_string;
  char *id_str_local;
  C3DFile *this_local;
  
  id_string.field_2._8_8_ = id_str;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,id_str,&local_41);
  std::allocator<char>::~allocator(&local_41);
  lVar3 = std::__cxx11::string::find((char *)local_40,0x12707e);
  if (lVar3 == -1) {
    __assert_fail("id_string.find(\":\") != std::string::npos",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                  ,0x19a,"ParameterInfo C3DFile::getParamInfo(const char *)");
  }
  std::__cxx11::string::string((string *)(param.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_98);
  std::__cxx11::string::find((char *)local_40,0x12707e);
  std::__cxx11::string::substr((ulong)local_b8,(ulong)local_40);
  std::__cxx11::string::operator=((string *)(param.field_2._M_local_buf + 8),local_b8);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::find((char *)local_40,0x12707e);
  std::__cxx11::string::length();
  std::__cxx11::string::substr((ulong)local_d8,(ulong)local_40);
  std::__cxx11::string::operator=(local_98,local_d8);
  std::__cxx11::string::~string(local_d8);
  group_iter._M_current._7_1_ = -1;
  local_f0._M_current =
       (GroupInfo *)std::vector<GroupInfo,_std::allocator<GroupInfo>_>::begin(&this->group_infos);
  __gnu_cxx::__normal_iterator<GroupInfo_const*,std::vector<GroupInfo,std::allocator<GroupInfo>>>::
  __normal_iterator<GroupInfo*>
            ((__normal_iterator<GroupInfo_const*,std::vector<GroupInfo,std::allocator<GroupInfo>>> *
             )&local_e8,&local_f0);
  while( true ) {
    local_f8._M_current =
         (GroupInfo *)std::vector<GroupInfo,_std::allocator<GroupInfo>_>::end(&this->group_infos);
    bVar1 = __gnu_cxx::operator!=(&local_e8,&local_f8);
    if (!bVar1) break;
    pcVar4 = (char *)std::__cxx11::string::c_str();
    pGVar5 = __gnu_cxx::
             __normal_iterator<const_GroupInfo_*,_std::vector<GroupInfo,_std::allocator<GroupInfo>_>_>
             ::operator->(&local_e8);
    iVar2 = strcmp(pcVar4,pGVar5->name);
    if (iVar2 == 0) {
      pGVar5 = __gnu_cxx::
               __normal_iterator<const_GroupInfo_*,_std::vector<GroupInfo,_std::allocator<GroupInfo>_>_>
               ::operator->(&local_e8);
      group_iter._M_current._7_1_ = pGVar5->id;
      break;
    }
    __gnu_cxx::
    __normal_iterator<const_GroupInfo_*,_std::vector<GroupInfo,_std::allocator<GroupInfo>_>_>::
    operator++(&local_e8,0);
  }
  param_iter._M_current =
       (ParameterInfo *)std::vector<GroupInfo,_std::allocator<GroupInfo>_>::end(&this->group_infos);
  bVar1 = __gnu_cxx::operator!=
                    (&local_e8,
                     (__normal_iterator<GroupInfo_*,_std::vector<GroupInfo,_std::allocator<GroupInfo>_>_>
                      *)&param_iter);
  if (!bVar1) {
    __assert_fail("group_iter != group_infos.end() && \"Could not find group!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                  ,0x1b0,"ParameterInfo C3DFile::getParamInfo(const char *)");
  }
  local_118._M_current =
       (ParameterInfo *)
       std::vector<ParameterInfo,_std::allocator<ParameterInfo>_>::begin(&this->param_infos);
  __gnu_cxx::
  __normal_iterator<ParameterInfo_const*,std::vector<ParameterInfo,std::allocator<ParameterInfo>>>::
  __normal_iterator<ParameterInfo*>
            ((__normal_iterator<ParameterInfo_const*,std::vector<ParameterInfo,std::allocator<ParameterInfo>>>
              *)&local_110,&local_118);
  while( true ) {
    local_120._M_current =
         (ParameterInfo *)
         std::vector<ParameterInfo,_std::allocator<ParameterInfo>_>::end(&this->param_infos);
    bVar1 = __gnu_cxx::operator!=(&local_110,&local_120);
    if (!bVar1) break;
    __s1 = (char *)std::__cxx11::string::c_str();
    pPVar6 = __gnu_cxx::
             __normal_iterator<const_ParameterInfo_*,_std::vector<ParameterInfo,_std::allocator<ParameterInfo>_>_>
             ::operator->(&local_110);
    pcVar4 = pPVar6->name;
    pPVar6 = __gnu_cxx::
             __normal_iterator<const_ParameterInfo_*,_std::vector<ParameterInfo,_std::allocator<ParameterInfo>_>_>
             ::operator->(&local_110);
    iVar2 = strncmp(__s1,pcVar4,(long)pPVar6->name_length);
    if ((iVar2 == 0) &&
       (pPVar6 = __gnu_cxx::
                 __normal_iterator<const_ParameterInfo_*,_std::vector<ParameterInfo,_std::allocator<ParameterInfo>_>_>
                 ::operator->(&local_110),
       (int)pPVar6->group_id == -(int)group_iter._M_current._7_1_)) break;
    local_128 = (ParameterInfo *)
                __gnu_cxx::
                __normal_iterator<const_ParameterInfo_*,_std::vector<ParameterInfo,_std::allocator<ParameterInfo>_>_>
                ::operator++(&local_110,0);
  }
  local_130._M_current =
       (ParameterInfo *)
       std::vector<ParameterInfo,_std::allocator<ParameterInfo>_>::end(&this->param_infos);
  bVar1 = __gnu_cxx::operator!=(&local_110,&local_130);
  if (bVar1) {
    info = __gnu_cxx::
           __normal_iterator<const_ParameterInfo_*,_std::vector<ParameterInfo,_std::allocator<ParameterInfo>_>_>
           ::operator*(&local_110);
    ParameterInfo::ParameterInfo(__return_storage_ptr__,info);
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string((string *)(param.field_2._M_local_buf + 8));
    std::__cxx11::string::~string(local_40);
    return __return_storage_ptr__;
  }
  __assert_fail("param_iter != param_infos.end() && \"Could not find parameter with the specified group\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                ,0x1bc,"ParameterInfo C3DFile::getParamInfo(const char *)");
}

Assistant:

ParameterInfo C3DFile::getParamInfo (const char *id_str) {
	std::string id_string (id_str);
	assert (id_string.find(":") != std::string::npos);

	std::string group;
	std::string param;

	group = id_string.substr(0, id_string.find(":"));
	param = id_string.substr(id_string.find(":") + 1, id_string.length());

//	std::cout << "group = " << group << " param = " << param << std::endl;

	Sint8 group_id = -1;

	// search for the group id first as we need to find the parameter with the
	// given id
	std::vector<GroupInfo>::const_iterator group_iter = group_infos.begin();
	while (group_iter != group_infos.end()) {
		if (!strcmp(group.c_str(), group_iter->name)) {
			group_id = group_iter->id;
			break;
		}
		group_iter ++;
	}
	assert (group_iter != group_infos.end() && "Could not find group!");

	std::vector<ParameterInfo>::const_iterator param_iter = param_infos.begin();

	while (param_iter != param_infos.end()) {
		if (!strncmp(param.c_str(), param_iter->name, param_iter->name_length)
				&& param_iter->group_id == -group_id) {
			break;
		}
		param_iter++;
	}

	assert (param_iter != param_infos.end() && "Could not find parameter with the specified group");

	/*
	std::cout << "Group id = " << static_cast<int>(group_id)
		<< " param_iter->name = " << param_iter->name
		<< " param_iter->group_id = " << static_cast<int>(param_iter->group_id) << std::endl;
	*/
	
	return *param_iter;
}